

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-pause.c
# Opt level: O2

CURLcode Curl_cw_pause_flush(Curl_easy *data)

{
  CURLcode CVar1;
  Curl_cwriter *cw_pause;
  
  cw_pause = Curl_cwriter_get_by_type(data,&Curl_cwt_pause);
  if (cw_pause != (Curl_cwriter *)0x0) {
    CVar1 = cw_pause_flush(data,cw_pause);
    return CVar1;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_cw_pause_flush(struct Curl_easy *data)
{
  struct Curl_cwriter *cw_pause;
  CURLcode result = CURLE_OK;

  cw_pause = Curl_cwriter_get_by_type(data, &Curl_cwt_pause);
  if(cw_pause)
    result = cw_pause_flush(data, cw_pause);

  return result;
}